

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_submodule *
ly_ctx_get_submodule(ly_ctx *ctx,char *module,char *revision,char *submodule,char *sub_revision)

{
  uint uVar1;
  lys_submodule *plVar2;
  uint uVar3;
  int iVar4;
  lys_submodule *plVar5;
  LY_ERR *pLVar6;
  long lVar7;
  lys_module **pplVar8;
  lys_submodule *plVar9;
  lys_module *main_module;
  
  if ((submodule == (char *)0x0 || ctx == (ly_ctx *)0x0) ||
     (module == (char *)0x0 && revision != (char *)0x0)) {
    pLVar6 = ly_errno_location();
    *pLVar6 = LY_EINVAL;
    plVar5 = (lys_submodule *)0x0;
  }
  else {
    uVar3 = 0;
    plVar2 = (lys_submodule *)0x0;
LAB_00110063:
    do {
      plVar9 = plVar2;
      uVar1 = (ctx->models).used;
      if (uVar3 < uVar1) {
        pplVar8 = (ctx->models).list + uVar3;
        lVar7 = 0;
        do {
          main_module = *pplVar8;
          if ((main_module->field_0x40 & 0x40) == 0) {
            uVar3 = (uVar3 - (int)lVar7) + 1;
            goto LAB_001100ad;
          }
          lVar7 = lVar7 + -1;
          pplVar8 = pplVar8 + 1;
        } while ((ulong)uVar3 - (ulong)uVar1 != lVar7);
        uVar3 = uVar3 - (int)lVar7;
      }
      main_module = (lys_module *)0x0;
LAB_001100ad:
      if (main_module == (lys_module *)0x0) {
        return plVar9;
      }
      plVar2 = plVar9;
    } while ((((module != (char *)0x0) && (iVar4 = strcmp(main_module->name,module), iVar4 != 0)) ||
             ((revision != (char *)0x0 &&
              ((main_module->rev == (lys_revision *)0x0 ||
               (iVar4 = strcmp(revision,main_module->rev->date), iVar4 != 0)))))) ||
            (plVar5 = ly_ctx_get_submodule2(main_module,submodule), plVar5 == (lys_submodule *)0x0))
    ;
    if (sub_revision == (char *)0x0) {
      plVar2 = plVar5;
      if ((((plVar9 != (lys_submodule *)0x0) &&
           (plVar2 = plVar9, plVar5->rev != (lys_revision *)0x0)) &&
          (plVar2 = plVar5, plVar9->rev != (lys_revision *)0x0)) &&
         (iVar4 = strcmp(plVar5->rev->date,plVar9->rev->date), plVar2 = plVar9, 0 < iVar4)) {
        plVar2 = plVar5;
      }
      goto LAB_00110063;
    }
    if ((plVar5->rev == (lys_revision *)0x0) ||
       (iVar4 = strcmp(sub_revision,plVar5->rev->date), iVar4 != 0)) goto LAB_00110063;
  }
  return plVar5;
}

Assistant:

lys_submodule *
ly_ctx_get_submodule(const struct ly_ctx *ctx, const char *module, const char *revision, const char *submodule,
                     const char *sub_revision)
{
    const struct lys_module *mainmod;
    const struct lys_submodule *ret = NULL, *submod;
    uint32_t idx = 0;

    if (!ctx || !submodule || (revision && !module)) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    while ((mainmod = ly_ctx_get_module_iter(ctx, &idx))) {
        if (module && strcmp(mainmod->name, module)) {
            /* main module name does not match */
            continue;
        }

        if (revision && (!mainmod->rev || strcmp(revision, mainmod->rev[0].date))) {
            /* main module revision does not match */
            continue;
        }

        submod = ly_ctx_get_submodule2(mainmod, submodule);
        if (!submod) {
            continue;
        }

        if (!sub_revision) {
            /* store only if newer */
            if (ret) {
                if (submod->rev && (!ret->rev || (strcmp(submod->rev[0].date, ret->rev[0].date) > 0))) {
                    ret = submod;
                }
            } else {
                ret = submod;
            }
        } else {
            /* store only if revision matches, we are done if it does */
            if (!submod->rev) {
                continue;
            } else if (!strcmp(sub_revision, submod->rev[0].date)) {
                ret = submod;
                break;
            }
        }
    }

    return ret;
}